

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::Hashing::compute_hash_raytracing_pipeline
               (StateRecorder *recorder,VkRayTracingPipelineCreateInfoKHR *create_info,
               Hash *out_hash)

{
  uint uVar1;
  uint uVar2;
  VkRayTracingPipelineInterfaceCreateInfoKHR *pVVar3;
  VkPipelineDynamicStateCreateInfo *pVVar4;
  VkRayTracingShaderGroupCreateInfoKHR *pVVar5;
  bool bVar6;
  VkPipelineCreateFlags2CreateInfo *pVVar7;
  long lVar8;
  ulong uVar9;
  Hasher local_48;
  Hash hash;
  ulong *local_38;
  
  pVVar7 = find_pnext<VkPipelineCreateFlags2CreateInfo>
                     ((VkStructureType)create_info->pNext,create_info);
  uVar1 = create_info->flags;
  uVar2 = create_info->maxPipelineRayRecursionDepth;
  bVar6 = StateRecorder::get_hash_for_pipeline_layout(recorder,create_info->layout,&hash);
  if (bVar6) {
    uVar9 = 0x8328807b4eb6fed;
    if (pVVar7 == (VkPipelineCreateFlags2CreateInfo *)0x0) {
      uVar9 = ((ulong)(uVar1 & 0x7ffffc3f) ^ 0xaf63bd4c8601b7df) * 0x100000001b3;
    }
    uVar9 = (hash & 0xffffffff ^ (uVar9 ^ uVar2) * 0x100000001b3) * 0x100000001b3 ^ hash >> 0x20;
    local_38 = out_hash;
    if (((create_info->flags & 4) == 0) || (create_info->basePipelineHandle == (VkPipeline)0x0)) {
      uVar9 = uVar9 * 0x100000001b3;
    }
    else {
      bVar6 = StateRecorder::get_hash_for_raytracing_pipeline_handle
                        (recorder,create_info->basePipelineHandle,&hash);
      if (!bVar6) {
        return false;
      }
      uVar9 = ((hash & 0xffffffff ^ uVar9 * 0x100000001b3) * 0x100000001b3 ^ hash >> 0x20) *
              0x100000001b3 ^ (ulong)(uint)create_info->basePipelineIndex;
    }
    local_48.h = uVar9 * 0x100000001b3 ^ (ulong)create_info->stageCount;
    uVar9 = 0xffffffffffffffff;
    lVar8 = 0;
    do {
      uVar9 = uVar9 + 1;
      if (create_info->stageCount <= uVar9) {
        pVVar3 = create_info->pLibraryInterface;
        if (pVVar3 == (VkRayTracingPipelineInterfaceCreateInfoKHR *)0x0) {
          local_48.h = local_48.h * 0x100000001b3;
        }
        else {
          local_48.h = (local_48.h * 0x100000001b3 ^ (ulong)pVVar3->maxPipelineRayHitAttributeSize)
                       * 0x100000001b3 ^ (ulong)pVVar3->maxPipelineRayPayloadSize;
          bVar6 = hash_pnext_chain(recorder,&local_48,pVVar3->pNext,(DynamicStateInfo *)0x0,0);
          if (!bVar6) {
            return false;
          }
        }
        pVVar4 = create_info->pDynamicState;
        if (pVVar4 == (VkPipelineDynamicStateCreateInfo *)0x0) {
          local_48.h = local_48.h * 0x100000001b3;
        }
        else {
          local_48.h = (local_48.h * 0x100000001b3 ^ (ulong)pVVar4->dynamicStateCount) *
                       0x100000001b3 ^ (ulong)pVVar4->flags;
          for (uVar9 = 0; pVVar4->dynamicStateCount != uVar9; uVar9 = uVar9 + 1) {
            local_48.h = local_48.h * 0x100000001b3 ^ (ulong)pVVar4->pDynamicStates[uVar9];
          }
          bVar6 = hash_pnext_chain(recorder,&local_48,pVVar4->pNext,(DynamicStateInfo *)0x0,0);
          if (!bVar6) {
            return false;
          }
        }
        local_48.h = local_48.h * 0x100000001b3 ^ (ulong)create_info->groupCount;
        uVar9 = 0xffffffffffffffff;
        lVar8 = 0x20;
        while (uVar9 = uVar9 + 1, uVar9 < create_info->groupCount) {
          pVVar5 = create_info->pGroups;
          local_48.h = ((((local_48.h * 0x100000001b3 ^
                          (ulong)*(uint *)((long)pVVar5 + lVar8 + -0x10)) * 0x100000001b3 ^
                         (ulong)*(uint *)((long)pVVar5 + lVar8 + -4)) * 0x100000001b3 ^
                        (ulong)*(uint *)((long)pVVar5 + lVar8 + -8)) * 0x100000001b3 ^
                       (ulong)*(uint *)((long)pVVar5 + lVar8 + -0xc)) * 0x100000001b3 ^
                       (ulong)*(uint *)((long)&pVVar5->sType + lVar8);
          bVar6 = hash_pnext_chain(recorder,&local_48,*(void **)((long)pVVar5 + lVar8 + -0x18),
                                   (DynamicStateInfo *)0x0,0);
          lVar8 = lVar8 + 0x30;
          if (!bVar6) {
            return false;
          }
        }
        if (create_info->pLibraryInfo == (VkPipelineLibraryCreateInfoKHR *)0x0) {
          local_48.h = local_48.h * 0x100000001b3;
        }
        else {
          bVar6 = hash_pnext_struct(recorder,&local_48,create_info->pLibraryInfo);
          if (!bVar6) {
            return false;
          }
          bVar6 = hash_pnext_chain(recorder,&local_48,create_info->pLibraryInfo->pNext,
                                   (DynamicStateInfo *)0x0,0);
          if (!bVar6) {
            return false;
          }
        }
        bVar6 = hash_pnext_chain(recorder,&local_48,create_info->pNext,(DynamicStateInfo *)0x0,0);
        if (bVar6) {
          *local_38 = local_48.h;
          return true;
        }
        return false;
      }
      bVar6 = compute_hash_stage(recorder,&local_48,
                                 (VkPipelineShaderStageCreateInfo *)
                                 ((long)&create_info->pStages->sType + lVar8));
      lVar8 = lVar8 + 0x30;
    } while (bVar6);
  }
  return false;
}

Assistant:

bool compute_hash_raytracing_pipeline(const StateRecorder &recorder,
                                      const VkRayTracingPipelineCreateInfoKHR &create_info,
                                      Hash *out_hash)
{
	Hasher h;
	Hash hash;

	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, create_info.pNext))
		h.u32(0);
	else
		h.u32(normalize_pipeline_creation_flags(create_info.flags));

	h.u32(create_info.maxPipelineRayRecursionDepth);

	if (!recorder.get_hash_for_pipeline_layout(create_info.layout, &hash))
		return false;
	h.u64(hash);

	if ((create_info.flags & VK_PIPELINE_CREATE_DERIVATIVE_BIT) != 0 &&
	    create_info.basePipelineHandle != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_raytracing_pipeline_handle(create_info.basePipelineHandle, &hash))
			return false;
		h.u64(hash);
		h.s32(create_info.basePipelineIndex);
	}
	else
		h.u32(0);

	h.u32(create_info.stageCount);
	for (uint32_t i = 0; i < create_info.stageCount; i++)
	{
		auto &stage = create_info.pStages[i];
		if (!compute_hash_stage(recorder, h, stage))
			return false;
	}

	if (create_info.pLibraryInterface)
	{
		h.u32(create_info.pLibraryInterface->maxPipelineRayHitAttributeSize);
		h.u32(create_info.pLibraryInterface->maxPipelineRayPayloadSize);
		if (!hash_pnext_chain(&recorder, h, create_info.pLibraryInterface->pNext, nullptr, 0))
			return false;
	}
	else
		h.u32(0);

	if (create_info.pDynamicState)
	{
		h.u32(create_info.pDynamicState->dynamicStateCount);
		h.u32(create_info.pDynamicState->flags);
		for (uint32_t i = 0; i < create_info.pDynamicState->dynamicStateCount; i++)
			h.u32(create_info.pDynamicState->pDynamicStates[i]);
		if (!hash_pnext_chain(&recorder, h, create_info.pDynamicState->pNext, nullptr, 0))
			return false;
	}
	else
		h.u32(0);

	h.u32(create_info.groupCount);
	for (uint32_t i = 0; i < create_info.groupCount; i++)
	{
		auto &group = create_info.pGroups[i];
		h.u32(group.type);
		h.u32(group.anyHitShader);
		h.u32(group.closestHitShader);
		h.u32(group.generalShader);
		h.u32(group.intersectionShader);
		if (!hash_pnext_chain(&recorder, h, group.pNext, nullptr, 0))
			return false;
	}

	if (create_info.pLibraryInfo)
	{
		if (!hash_pnext_struct(&recorder, h, *create_info.pLibraryInfo))
			return false;
		if (!hash_pnext_chain(&recorder, h, create_info.pLibraryInfo->pNext, nullptr, 0))
			return false;
	}
	else
		h.u32(0);

	if (!hash_pnext_chain(&recorder, h, create_info.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}